

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

cni_holder_base *
cs_impl::cni::construct_helper<void(cs_impl::member_visitor::*)(cs_impl::any_const&)const>::
_construct<void(cs_impl::member_visitor::*&)(cs_impl::any_const&)const,void,cs_impl::member_visitor_const&,cs_impl::any_const&>
          (offset_in_member_visitor_to_subr *val,
          _func_void_member_visitor_ptr_any_ptr *target_function)

{
  cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
  *this;
  
  this = (cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
          *)operator_new(0x28);
  cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
  ::cni_holder(this,val);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}